

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

Vec4<double> * __thiscall
Imath_2_5::Box<Imath_2_5::Vec4<double>_>::center(Box<Imath_2_5::Vec4<double>_> *this)

{
  Vec4<double> *in_RDI;
  Vec4<double> *this_00;
  
  this_00 = in_RDI;
  Vec4<double>::operator+(in_RDI,in_RDI);
  Vec4<double>::operator/(this_00,(double)in_RDI);
  return this_00;
}

Assistant:

inline T
Box<T>::center() const 
{ 
    return (max + min) / 2;
}